

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

XMLElement * CGL::Collada::ColladaParser::get_element(XMLElement *xml,string *query)

{
  _Ios_Openmode _Var1;
  istream *piVar2;
  char *pcVar3;
  string *in_RSI;
  XMLElement *in_RDI;
  string id;
  char *url;
  string token;
  XMLElement *e;
  stringstream ss;
  char *in_stack_fffffffffffffd88;
  XMLElement *pXVar4;
  XMLNode *in_stack_fffffffffffffd90;
  XMLElement *in_stack_fffffffffffffd98;
  string *id_00;
  bool local_229;
  string local_220 [39];
  undefined1 local_1f9 [33];
  char *local_1d8;
  string local_1c0 [32];
  XMLElement *local_1a0;
  stringstream local_198 [400];
  XMLElement *local_8;
  
  local_8 = in_RDI;
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,in_RSI,_Var1);
  local_1a0 = local_8;
  std::__cxx11::string::string(local_1c0);
  while( true ) {
    local_229 = false;
    if (local_1a0 != (XMLElement *)0x0) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_198,local_1c0,'/');
      local_229 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    }
    if (local_229 == false) break;
    std::__cxx11::string::c_str();
    local_1a0 = tinyxml2::XMLNode::FirstChildElement
                          (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  if ((local_1a0 != (XMLElement *)0x0) &&
     (local_1d8 = tinyxml2::XMLElement::Attribute
                            (in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                             in_stack_fffffffffffffd88), local_1d8 != (char *)0x0)) {
    pcVar3 = local_1d8 + 1;
    id_00 = (string *)local_1f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1f9 + 1),pcVar3,(allocator *)id_00);
    std::allocator<char>::~allocator((allocator<char> *)local_1f9);
    std::__cxx11::string::string(local_220,(string *)(local_1f9 + 1));
    local_1a0 = uri_find(id_00);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string((string *)(local_1f9 + 1));
  }
  pXVar4 = local_1a0;
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return pXVar4;
}

Assistant:

XMLElement* ColladaParser::get_element( XMLElement* xml, string query ) {

  stringstream ss (query);

  // find xml element
  XMLElement* e = xml; string token;
  while( e && getline(ss, token, '/') ) {
    e = e->FirstChildElement( token.c_str() );
  }

  // handle indirection
  if (e) {
    const char* url = e->Attribute("url");
    if (url) {
      string id = url + 1;
      e = uri_find(id);
    }
  }

  return e;
}